

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmImportedCxxModuleInfo.cxx
# Opt level: O0

string * __thiscall
ImportedCxxModuleLookup::BmiNameForSource
          (string *__return_storage_ptr__,ImportedCxxModuleLookup *this,string *path)

{
  iterator __args;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  ImportedCxxModuleGeneratorInfo local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string_view local_110;
  undefined1 local_100 [8];
  string dirhash;
  string local_c0;
  string_view local_a0;
  undefined1 local_90 [8];
  string safename;
  size_t HASH_TRUNCATION;
  undefined1 local_50 [8];
  cmCryptoHash hasher;
  _Self local_38;
  iterator importit;
  _Self local_28;
  iterator genit;
  string *path_local;
  ImportedCxxModuleLookup *this_local;
  string *bmiName;
  
  genit._M_node = (_Base_ptr)path;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo>_>_>
       ::find(&this->GeneratorInfo,path);
  importit._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo>_>_>
       ::end(&this->GeneratorInfo);
  bVar1 = std::operator!=(&local_28,(_Self *)&importit);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  }
  else {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo>_>_>
         ::find(&this->ImportedInfo,genit._M_node);
    hasher.CTX._7_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_50,AlgoSHA3_512);
    safename.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo>_>_>
         ::end(&this->ImportedInfo);
    bVar1 = std::operator!=(&local_38,(_Self *)((long)&safename.field_2 + 8));
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo>_>
               ::operator->(&local_38);
      local_a0 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&ppVar3->second)
      ;
      cmCryptoHash::HashString_abi_cxx11_((string *)local_90,(cmCryptoHash *)local_50,local_a0);
      std::__cxx11::string::substr((ulong)((long)&dirhash.field_2 + 8),(ulong)local_90);
      cmStrCat<std::__cxx11::string,char_const(&)[5]>
                (&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dirhash.field_2 + 8),(char (*) [5])".bmi");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)(dirhash.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_90);
    }
    else {
      local_110 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)genit._M_node);
      cmCryptoHash::HashString_abi_cxx11_((string *)local_100,(cmCryptoHash *)local_50,local_110);
      std::__cxx11::string::substr((ulong)&local_150,(ulong)local_100);
      cmStrCat<std::__cxx11::string,char_const(&)[5]>(&local_130,&local_150,(char (*) [5])".bmi");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)local_100);
    }
    __args._M_node = genit._M_node;
    std::__cxx11::string::string((string *)&local_170,(string *)__return_storage_ptr__);
    std::
    map<std::__cxx11::string,ImportedCxxModuleGeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>>>
    ::emplace<std::__cxx11::string_const&,ImportedCxxModuleGeneratorInfo>
              ((map<std::__cxx11::string,ImportedCxxModuleGeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>>>
                *)&this->GeneratorInfo,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args._M_node,
               &local_170);
    ImportedCxxModuleGeneratorInfo::~ImportedCxxModuleGeneratorInfo(&local_170);
    hasher.CTX._7_1_ = 1;
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_50);
    if ((hasher.CTX._7_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImportedCxxModuleLookup::BmiNameForSource(std::string const& path)
{
  auto genit = this->GeneratorInfo.find(path);
  if (genit != this->GeneratorInfo.end()) {
    return genit->second.BmiName;
  }

  auto importit = this->ImportedInfo.find(path);
  std::string bmiName;
  cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_512);
  constexpr size_t HASH_TRUNCATION = 12;
  if (importit != this->ImportedInfo.end()) {
    auto safename = hasher.HashString(importit->second.Name);
    bmiName = cmStrCat(safename.substr(0, HASH_TRUNCATION), ".bmi");
  } else {
    auto dirhash = hasher.HashString(path);
    bmiName = cmStrCat(dirhash.substr(0, HASH_TRUNCATION), ".bmi");
  }

  this->GeneratorInfo.emplace(path, ImportedCxxModuleGeneratorInfo{ bmiName });
  return bmiName;
}